

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralContactClipping.cpp
# Opt level: O3

bool cbtPolyhedralContactClipping::findSeparatingAxis
               (cbtConvexPolyhedron *hullA,cbtConvexPolyhedron *hullB,cbtTransform *transA,
               cbtTransform *transB,cbtVector3 *sep,Result *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  cbtFace *pcVar8;
  cbtVector3 *pcVar9;
  cbtScalar acVar10 [4];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  cbtVector3 cVar14;
  bool bVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  float fVar34;
  cbtScalar local_1fc;
  cbtVector3 faceANormalWS;
  cbtScalar d;
  float local_1e0;
  float local_1dc;
  int local_1d8;
  int local_1d4;
  long local_1d0;
  cbtVector3 *local_1c8;
  int local_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  cbtVector3 wA;
  cbtVector3 wB;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  cbtVector3 DeltaC2;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  float local_108;
  undefined4 uStack_104;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  float local_c8;
  float local_b8;
  float local_a8;
  
  gActualSATPairTests = gActualSATPairTests + 1;
  fVar24 = (hullA->m_localCenter).m_floats[1];
  cVar1 = (hullA->m_localCenter).m_floats[0];
  cVar2 = (hullA->m_localCenter).m_floats[2];
  cVar3 = (hullB->m_localCenter).m_floats[2];
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transA->m_basis).m_el[0].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]));
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transA->m_basis).m_el[1].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]));
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transA->m_basis).m_el[2].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]));
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar2),
                            ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]));
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar2),
                            ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]));
  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar2),
                            ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]));
  cVar1 = (hullB->m_localCenter).m_floats[0];
  fVar24 = (hullB->m_localCenter).m_floats[1];
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transB->m_basis).m_el[0].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]));
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transB->m_basis).m_el[1].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transB->m_basis).m_el[2].m_floats[1])),
                            ZEXT416((uint)cVar1),
                            ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]));
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar3),
                            ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]));
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar3),
                            ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)cVar3),
                            ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]));
  local_1a8 = ZEXT416((uint)((auVar21._0_4_ + (transA->m_origin).m_floats[0]) -
                            (auVar30._0_4_ + (transB->m_origin).m_floats[0])));
  local_1b8 = ZEXT416((uint)((auVar27._0_4_ + (transA->m_origin).m_floats[1]) -
                            (auVar20._0_4_ + (transB->m_origin).m_floats[1])));
  auVar21 = vinsertps_avx(local_1a8,local_1b8,0x10);
  local_198 = ZEXT416((uint)((auVar28._0_4_ + (transA->m_origin).m_floats[2]) -
                            (auVar11._0_4_ + (transB->m_origin).m_floats[2])));
  DeltaC2.m_floats = (cbtScalar  [4])vinsertps_avx(auVar21,local_198,0x28);
  lVar17 = (long)(hullA->m_faces).m_size;
  local_1c8 = sep;
  if (lVar17 < 1) {
    local_1fc = 3.4028235e+38;
  }
  else {
    lVar18 = 0;
    local_1fc = 3.4028235e+38;
    do {
      pcVar8 = (hullA->m_faces).m_data;
      fVar24 = *(float *)((long)pcVar8->m_plane + lVar18 + 4);
      uVar4 = *(uint *)((long)pcVar8->m_plane + lVar18);
      uVar5 = *(uint *)((long)pcVar8->m_plane + lVar18 + 8);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transA->m_basis).m_el[1].m_floats[1])),
                                ZEXT416(uVar4),ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]))
      ;
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transA->m_basis).m_el[0].m_floats[1])),
                                ZEXT416(uVar4),ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]))
      ;
      auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transA->m_basis).m_el[2].m_floats[1])),
                                ZEXT416(uVar4),ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]))
      ;
      auVar30 = vfmadd231ss_fma(auVar21,ZEXT416(uVar5),
                                ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]));
      auVar27 = vfmadd231ss_fma(auVar27,ZEXT416(uVar5),
                                ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]));
      auVar28 = vfmadd231ss_fma(auVar28,ZEXT416(uVar5),
                                ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]));
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * (float)local_1b8._0_4_)),auVar27,
                                ZEXT416((uint)local_1a8._0_4_));
      auVar20 = vfmadd231ss_fma(auVar21,auVar28,ZEXT416((uint)local_198._0_4_));
      auVar21 = vinsertps_avx(auVar27,auVar30,0x10);
      acVar10 = (cbtScalar  [4])vinsertps_avx(auVar21,auVar28,0x28);
      faceANormalWS.m_floats = acVar10;
      if (auVar20._0_4_ < 0.0) {
        faceANormalWS.m_floats._0_8_ = CONCAT44(auVar30._0_4_,auVar27._0_4_) ^ 0x8000000080000000;
        faceANormalWS.m_floats[3] = acVar10[3];
        faceANormalWS.m_floats[2] = -auVar28._0_4_;
      }
      gExpectedNbTests = gExpectedNbTests + 1;
      if ((gUseInternalObject != true) ||
         (bVar15 = TestInternalObjects(transA,transB,&DeltaC2,&faceANormalWS,hullA,hullB,local_1fc),
         bVar15)) {
        gActualNbTests = gActualNbTests + 1;
        bVar15 = TestSepAxis(hullA,hullB,transA,transB,&faceANormalWS,&d,&wA,&wB);
        if (!bVar15) {
          return false;
        }
        if (d < local_1fc) {
          local_1fc = d;
          *(undefined8 *)local_1c8->m_floats = faceANormalWS.m_floats._0_8_;
          *(undefined8 *)(local_1c8->m_floats + 2) = faceANormalWS.m_floats._8_8_;
        }
      }
      lVar18 = lVar18 + 0x30;
    } while (lVar17 * 0x30 != lVar18);
  }
  lVar17 = (long)(hullB->m_faces).m_size;
  if (0 < lVar17) {
    lVar18 = 0;
    do {
      pcVar8 = (hullB->m_faces).m_data;
      fVar24 = *(float *)((long)pcVar8->m_plane + lVar18 + 4);
      uVar4 = *(uint *)((long)pcVar8->m_plane + lVar18);
      uVar5 = *(uint *)((long)pcVar8->m_plane + lVar18 + 8);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transB->m_basis).m_el[1].m_floats[1])),
                                ZEXT416(uVar4),ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]))
      ;
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transB->m_basis).m_el[0].m_floats[1])),
                                ZEXT416(uVar4),ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]))
      ;
      auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transB->m_basis).m_el[2].m_floats[1])),
                                ZEXT416(uVar4),ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]))
      ;
      auVar30 = vfmadd231ss_fma(auVar21,ZEXT416(uVar5),
                                ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]));
      auVar27 = vfmadd231ss_fma(auVar27,ZEXT416(uVar5),
                                ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]));
      auVar28 = vfmadd231ss_fma(auVar28,ZEXT416(uVar5),
                                ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]));
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * (float)local_1b8._0_4_)),auVar27,
                                ZEXT416((uint)local_1a8._0_4_));
      auVar20 = vfmadd231ss_fma(auVar21,auVar28,ZEXT416((uint)local_198._0_4_));
      auVar21 = vinsertps_avx(auVar27,auVar30,0x10);
      acVar10 = (cbtScalar  [4])vinsertps_avx(auVar21,auVar28,0x28);
      faceANormalWS.m_floats = acVar10;
      if (auVar20._0_4_ < 0.0) {
        faceANormalWS.m_floats._0_8_ = CONCAT44(auVar30._0_4_,auVar27._0_4_) ^ 0x8000000080000000;
        faceANormalWS.m_floats[3] = acVar10[3];
        faceANormalWS.m_floats[2] = -auVar28._0_4_;
      }
      gExpectedNbTests = gExpectedNbTests + 1;
      if ((gUseInternalObject != true) ||
         (bVar15 = TestInternalObjects(transA,transB,&DeltaC2,&faceANormalWS,hullA,hullB,local_1fc),
         bVar15)) {
        gActualNbTests = gActualNbTests + 1;
        bVar15 = TestSepAxis(hullA,hullB,transA,transB,&faceANormalWS,&d,&wA,&wB);
        if (!bVar15) {
          return false;
        }
        if (d < local_1fc) {
          local_1fc = d;
          *(undefined8 *)local_1c8->m_floats = faceANormalWS.m_floats._0_8_;
          *(undefined8 *)(local_1c8->m_floats + 2) = faceANormalWS.m_floats._8_8_;
        }
      }
      lVar18 = lVar18 + 0x30;
    } while (lVar17 * 0x30 != lVar18);
  }
  iVar16 = (hullA->m_uniqueEdges).m_size;
  if (iVar16 < 1) goto LAB_008e8ea5;
  auVar33 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
  iVar19 = (hullB->m_uniqueEdges).m_size;
  local_1d4 = -1;
  local_1d0 = 0;
  local_1d8 = -1;
  local_1dc = 0.0;
  local_1e0 = 0.0;
  _local_168 = ZEXT416(0) << 0x40;
  local_f8 = _local_168;
  do {
    if (0 < iVar19) {
      pcVar9 = (hullA->m_uniqueEdges).m_data;
      lVar17 = 8;
      lVar18 = 0;
      fVar24 = pcVar9[local_1d0].m_floats[1];
      cVar1 = pcVar9[local_1d0].m_floats[0];
      cVar2 = pcVar9[local_1d0].m_floats[2];
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transA->m_basis).m_el[0].m_floats[1])),
                                ZEXT416((uint)cVar1),
                                ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[0]));
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transA->m_basis).m_el[1].m_floats[1])),
                                ZEXT416((uint)cVar1),
                                ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[0]));
      auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (transA->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)cVar1),
                                ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[0]));
      auVar30 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar2),
                                ZEXT416((uint)(transA->m_basis).m_el[0].m_floats[2]));
      auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)cVar2),
                                ZEXT416((uint)(transA->m_basis).m_el[1].m_floats[2]));
      auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)cVar2),
                                ZEXT416((uint)(transA->m_basis).m_el[2].m_floats[2]));
      auVar21 = vinsertps_avx(auVar30,auVar27,0x10);
      fVar24 = auVar28._0_4_;
      local_a8 = -fVar24;
      local_b8 = -auVar30._0_4_;
      local_c8 = -auVar27._0_4_;
      do {
        pcVar9 = (hullB->m_uniqueEdges).m_data;
        fVar34 = *(float *)((long)pcVar9->m_floats + lVar17 + -4);
        uVar4 = *(uint *)((long)pcVar9->m_floats + lVar17 + -8);
        uVar5 = *(uint *)((long)pcVar9->m_floats + lVar17);
        auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (transB->m_basis).m_el[0].m_floats[1])),
                                  ZEXT416(uVar4),
                                  ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[0]));
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (transB->m_basis).m_el[1].m_floats[1])),
                                  ZEXT416(uVar4),
                                  ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[0]));
        auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (transB->m_basis).m_el[2].m_floats[1])),
                                  ZEXT416(uVar4),
                                  ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[0]));
        auVar31 = vfmadd231ss_fma(auVar28,ZEXT416(uVar5),
                                  ZEXT416((uint)(transB->m_basis).m_el[0].m_floats[2]));
        auVar20 = vfmadd231ss_fma(auVar20,ZEXT416(uVar5),
                                  ZEXT416((uint)(transB->m_basis).m_el[1].m_floats[2]));
        auVar11 = vfmadd231ss_fma(auVar11,ZEXT416(uVar5),
                                  ZEXT416((uint)(transB->m_basis).m_el[2].m_floats[2]));
        auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar31._0_4_ * local_c8)),auVar20,
                                  ZEXT416((uint)auVar30._0_4_));
        auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * local_a8)),auVar11,
                                  ZEXT416((uint)auVar27._0_4_));
        auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * local_b8)),auVar31,
                                  ZEXT416((uint)fVar24));
        auVar28._4_8_ = SUB128(ZEXT812(0),4);
        auVar28._0_4_ = auVar32._0_4_;
        auVar28._12_4_ = 0;
        uVar6 = vmovlps_avx(auVar28);
        auVar22 = auVar33._0_16_;
        auVar28 = vandps_avx(auVar12,auVar22);
        if (((1e-06 < auVar28._0_4_) ||
            (auVar28 = vandps_avx(auVar25,auVar22), 1e-06 < auVar28._0_4_)) ||
           (auVar28 = vandps_avx(auVar32,auVar22), 1e-06 < auVar28._0_4_)) {
          fVar34 = auVar25._0_4_;
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),auVar12,auVar12);
          auVar28 = vfmadd231ss_fma(auVar28,auVar32,auVar32);
          auVar28 = vsqrtss_avx(auVar28,auVar28);
          fVar29 = 1.0 / auVar28._0_4_;
          faceANormalWS.m_floats[1] = fVar34 * fVar29;
          faceANormalWS.m_floats[0] = auVar12._0_4_ * fVar29;
          faceANormalWS.m_floats[2] = auVar32._0_4_ * fVar29;
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(faceANormalWS.m_floats[1] *
                                                  (float)local_1b8._0_4_)),
                                    ZEXT416((uint)faceANormalWS.m_floats[0]),
                                    ZEXT416((uint)local_1a8._0_4_));
          faceANormalWS.m_floats[3] = (cbtScalar)((ulong)uVar6 >> 0x20);
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)faceANormalWS.m_floats[2]),
                                    ZEXT416((uint)local_198._0_4_));
          if (auVar28._0_4_ < 0.0) {
            faceANormalWS.m_floats[1] = -faceANormalWS.m_floats[1];
            faceANormalWS.m_floats[0] = -faceANormalWS.m_floats[0];
            faceANormalWS.m_floats[2] = -faceANormalWS.m_floats[2];
          }
          faceANormalWS.m_floats[0] = (cbtScalar)faceANormalWS.m_floats[0];
          faceANormalWS.m_floats[1] = (cbtScalar)faceANormalWS.m_floats[1];
          faceANormalWS.m_floats[2] = (cbtScalar)faceANormalWS.m_floats[2];
          gExpectedNbTests = gExpectedNbTests + 1;
          if ((gUseInternalObject != true) ||
             (local_1bc = iVar19,
             bVar15 = TestInternalObjects(transA,transB,&DeltaC2,&faceANormalWS,hullA,hullB,
                                          local_1fc), bVar15)) {
            gActualNbTests = gActualNbTests + 1;
            bVar15 = TestSepAxis(hullA,hullB,transA,transB,&faceANormalWS,&d,&wA,&wB);
            cVar14 = wA;
            if (!bVar15) {
              return false;
            }
            auVar33 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            if (d < local_1fc) {
              local_1d8 = (int)lVar18;
              local_1fc = d;
              _local_118 = vinsertps_avx(auVar31,ZEXT416((uint)auVar20._0_4_),0x10);
              uStack_104 = 0;
              uStack_100 = 0;
              *(undefined8 *)local_1c8->m_floats = faceANormalWS.m_floats._0_8_;
              *(undefined8 *)(local_1c8->m_floats + 2) = faceANormalWS.m_floats._8_8_;
              local_1d4 = (int)local_1d0;
              local_1dc = wA.m_floats[2];
              _fStack_160 = 0;
              local_168._0_4_ = wB.m_floats[0];
              local_168._4_4_ = wB.m_floats[1];
              local_f8._8_8_ = 0;
              local_f8._0_4_ = wA.m_floats[0];
              local_f8._4_4_ = wA.m_floats[1];
              local_1e0 = wB.m_floats[2];
              local_128 = ZEXT416((uint)fVar24);
              _local_138 = auVar21;
              local_108 = auVar11._0_4_;
            }
            iVar19 = (hullB->m_uniqueEdges).m_size;
            wA = cVar14;
          }
          else {
            auVar33 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            iVar19 = local_1bc;
          }
        }
        lVar18 = lVar18 + 1;
        lVar17 = lVar17 + 0x10;
      } while (lVar18 < iVar19);
      iVar16 = (hullA->m_uniqueEdges).m_size;
    }
    local_1d0 = local_1d0 + 1;
  } while (local_1d0 < iVar16);
  if ((local_1d4 < 0) || (local_1d8 < 0)) goto LAB_008e8ea5;
  auVar11._4_4_ = uStack_104;
  auVar11._0_4_ = local_108;
  auVar11._8_8_ = uStack_100;
  auVar30 = vsubps_avx(_local_168,local_f8);
  fVar24 = local_1e0 - local_1dc;
  auVar21 = vmovshdup_avx(_local_118);
  auVar27 = vmovshdup_avx(_local_138);
  auVar28 = vmovshdup_avx(auVar30);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar21._0_4_)),_local_138,_local_118);
  auVar33 = ZEXT864(0) << 0x20;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * auVar28._0_4_)),_local_118,auVar30);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar28._0_4_)),_local_138,auVar30);
  auVar28 = vfmadd231ss_fma(auVar20,local_128,auVar11);
  auVar21 = vfmadd231ss_fma(auVar21,auVar11,ZEXT416((uint)fVar24));
  auVar20._8_4_ = 0x80000000;
  auVar20._0_8_ = 0x8000000080000000;
  auVar20._12_4_ = 0x80000000;
  auVar20 = vxorps_avx512vl(auVar21,auVar20);
  auVar21 = vfmadd231ss_fma(auVar27,local_128,ZEXT416((uint)fVar24));
  auVar27 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar28,auVar28);
  fVar34 = auVar27._0_4_;
  if ((fVar34 != 0.0) || (NAN(fVar34))) {
    auVar27 = vfmadd213ss_fma(auVar28,auVar20,auVar21);
    fVar34 = auVar27._0_4_ / fVar34;
    auVar33 = ZEXT464(0xf149f2ca);
    if ((-1e+30 <= fVar34) && (auVar33 = ZEXT1664(CONCAT124(auVar27._4_12_,fVar34)), 1e+30 < fVar34)
       ) {
      auVar33 = ZEXT464(0x7149f2ca);
    }
  }
  auVar27 = vfmadd231ss_fma(auVar20,auVar33._0_16_,auVar28);
  fVar34 = auVar27._0_4_;
  if (-1e+30 <= fVar34) {
    if (1e+30 < fVar34) {
      fVar34 = 1e+30;
      auVar33 = ZEXT1664(SUB6416(ZEXT464(0xf149f2ca),0));
      auVar21 = vfmadd213ss_fma(auVar28,SUB6416(ZEXT464(0x7149f2ca),0),auVar21);
      if (-1e+30 <= auVar21._0_4_) {
        fVar34 = 1e+30;
        auVar33 = ZEXT1664(auVar21);
        if (1e+30 < auVar21._0_4_) {
          auVar27 = SUB6416(ZEXT464(0x7149f2ca),0);
          goto LAB_008e8d24;
        }
      }
    }
  }
  else {
    fVar34 = -1e+30;
    auVar27 = SUB6416(ZEXT464(0xf149f2ca),0);
    auVar21 = vfmadd213ss_fma(auVar28,auVar27,auVar21);
    if (-1e+30 <= auVar21._0_4_) {
      if (auVar21._0_4_ <= 1e+30) {
        auVar33 = ZEXT1664(auVar21);
      }
      else {
        auVar33 = ZEXT464(0x7149f2ca);
      }
    }
    else {
LAB_008e8d24:
      fVar34 = auVar27._0_4_;
      auVar33 = ZEXT1664(auVar27);
    }
  }
  fVar29 = auVar33._0_4_;
  auVar27._0_4_ = fVar29 * (float)local_138._0_4_;
  auVar27._4_4_ = fVar29 * (float)local_138._4_4_;
  auVar27._8_4_ = fVar29 * fStack_130;
  auVar27._12_4_ = fVar29 * fStack_12c;
  auVar21 = vsubps_avx(auVar30,auVar27);
  fVar24 = fVar34 * local_108 + (fVar24 - fVar29 * (float)local_128._0_4_);
  auVar30._0_4_ = fVar34 * (float)local_118._0_4_ + auVar21._0_4_;
  auVar30._4_4_ = fVar34 * (float)local_118._4_4_ + auVar21._4_4_;
  auVar30._8_4_ = fVar34 * fStack_110 + auVar21._8_4_;
  auVar30._12_4_ = fVar34 * fStack_10c + auVar21._12_4_;
  uVar6 = vmovlps_avx(ZEXT416((uint)fVar24));
  auVar21._0_4_ = auVar30._0_4_ * auVar30._0_4_;
  auVar21._4_4_ = auVar30._4_4_ * auVar30._4_4_;
  auVar21._8_4_ = auVar30._8_4_ * auVar30._8_4_;
  auVar21._12_4_ = auVar30._12_4_ * auVar30._12_4_;
  auVar21 = vmovshdup_avx(auVar21);
  auVar21 = vfmadd231ss_fma(auVar21,auVar30,auVar30);
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
  if (1.1920929e-07 < auVar21._0_4_) {
    auVar27 = vsqrtss_avx(auVar21,auVar21);
    fVar29 = 1.0 / auVar27._0_4_;
    faceANormalWS.m_floats[2] = fVar29 * fVar24;
    auVar31._0_4_ = fVar29 * auVar30._0_4_;
    auVar31._4_4_ = fVar29 * auVar30._4_4_;
    auVar31._8_4_ = fVar29 * auVar30._8_4_;
    auVar31._12_4_ = fVar29 * auVar30._12_4_;
    auVar21 = vmovshdup_avx(auVar31);
    uVar7 = vmovlps_avx(auVar31);
    faceANormalWS.m_floats[3] = (cbtScalar)((ulong)uVar6 >> 0x20);
    faceANormalWS.m_floats[0] = (cbtScalar)(int)uVar7;
    faceANormalWS.m_floats[1] = (cbtScalar)(int)((ulong)uVar7 >> 0x20);
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * (float)local_1b8._0_4_)),auVar31,
                              ZEXT416((uint)local_1a8._0_4_));
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)faceANormalWS.m_floats[2]),
                              ZEXT416((uint)local_198._0_4_));
    if (auVar21._0_4_ < 0.0) {
      uVar13 = CONCAT44(auVar31._4_4_,auVar31._0_4_);
      auVar32._0_8_ = uVar13 ^ 0x8000000080000000;
      auVar32._8_4_ = -auVar31._8_4_;
      auVar32._12_4_ = -auVar31._12_4_;
      uVar6 = vmovlps_avx(auVar32);
      faceANormalWS.m_floats[2] = -faceANormalWS.m_floats[2];
      faceANormalWS.m_floats[0] = (cbtScalar)(int)uVar6;
      faceANormalWS.m_floats[1] = (cbtScalar)(int)((ulong)uVar6 >> 0x20);
    }
    faceANormalWS.m_floats[0] = (cbtScalar)faceANormalWS.m_floats[0];
    faceANormalWS.m_floats[1] = (cbtScalar)faceANormalWS.m_floats[1];
    faceANormalWS.m_floats[2] = (cbtScalar)faceANormalWS.m_floats[2];
    auVar25._0_4_ = fVar34 * (float)local_118._0_4_ + (float)local_168._0_4_;
    auVar25._4_4_ = fVar34 * (float)local_118._4_4_ + (float)local_168._4_4_;
    auVar25._8_4_ = fVar34 * fStack_110 + fStack_160;
    auVar25._12_4_ = fVar34 * fStack_10c + fStack_15c;
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar21 = vxorps_avx512vl(auVar27,auVar12);
    wA.m_floats = (cbtScalar  [4])
                  vinsertps_avx(auVar25,ZEXT416((uint)(fVar34 * local_108 + local_1e0)),0x28);
    (*resultOut->_vptr_Result[4])(auVar21._0_8_,resultOut,&faceANormalWS);
  }
LAB_008e8ea5:
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)local_1c8->m_floats;
  auVar21 = vmovshdup_avx(auVar22);
  auVar21 = vfmadd213ss_fma(local_1a8,auVar22,
                            ZEXT416((uint)(auVar21._0_4_ * (float)local_1b8._0_4_)));
  auVar21 = vfmadd213ss_fma(local_198,ZEXT416((uint)local_1c8->m_floats[2]),auVar21);
  if (auVar21._0_4_ < 0.0) {
    auVar23._0_8_ = *(ulong *)local_1c8->m_floats ^ 0x8000000080000000;
    auVar23._8_4_ = 0x80000000;
    auVar23._12_4_ = 0x80000000;
    auVar26._0_4_ = -local_1c8->m_floats[2];
    auVar26._4_4_ = 0x80000000;
    auVar26._8_4_ = 0x80000000;
    auVar26._12_4_ = 0x80000000;
    auVar21 = vinsertps_avx(auVar23,auVar26,0x28);
    *(undefined1 (*) [16])local_1c8->m_floats = auVar21;
  }
  return true;
}

Assistant:

bool cbtPolyhedralContactClipping::findSeparatingAxis(const cbtConvexPolyhedron& hullA, const cbtConvexPolyhedron& hullB, const cbtTransform& transA, const cbtTransform& transB, cbtVector3& sep, cbtDiscreteCollisionDetectorInterface::Result& resultOut)
{
	gActualSATPairTests++;

	//#ifdef TEST_INTERNAL_OBJECTS
	const cbtVector3 c0 = transA * hullA.m_localCenter;
	const cbtVector3 c1 = transB * hullB.m_localCenter;
	const cbtVector3 DeltaC2 = c0 - c1;
	//#endif

	cbtScalar dmin = FLT_MAX;
	int curPlaneTests = 0;

	int numFacesA = hullA.m_faces.size();
	// Test normals from hullA
	for (int i = 0; i < numFacesA; i++)
	{
		const cbtVector3 Normal(hullA.m_faces[i].m_plane[0], hullA.m_faces[i].m_plane[1], hullA.m_faces[i].m_plane[2]);
		cbtVector3 faceANormalWS = transA.getBasis() * Normal;
		if (DeltaC2.dot(faceANormalWS) < 0)
			faceANormalWS *= -1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if (gUseInternalObject && !TestInternalObjects(transA, transB, DeltaC2, faceANormalWS, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		cbtScalar d;
		cbtVector3 wA, wB;
		if (!TestSepAxis(hullA, hullB, transA, transB, faceANormalWS, d, wA, wB))
			return false;

		if (d < dmin)
		{
			dmin = d;
			sep = faceANormalWS;
		}
	}

	int numFacesB = hullB.m_faces.size();
	// Test normals from hullB
	for (int i = 0; i < numFacesB; i++)
	{
		const cbtVector3 Normal(hullB.m_faces[i].m_plane[0], hullB.m_faces[i].m_plane[1], hullB.m_faces[i].m_plane[2]);
		cbtVector3 WorldNormal = transB.getBasis() * Normal;
		if (DeltaC2.dot(WorldNormal) < 0)
			WorldNormal *= -1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if (gUseInternalObject && !TestInternalObjects(transA, transB, DeltaC2, WorldNormal, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		cbtScalar d;
		cbtVector3 wA, wB;
		if (!TestSepAxis(hullA, hullB, transA, transB, WorldNormal, d, wA, wB))
			return false;

		if (d < dmin)
		{
			dmin = d;
			sep = WorldNormal;
		}
	}

	cbtVector3 edgeAstart, edgeAend, edgeBstart, edgeBend;
	int edgeA = -1;
	int edgeB = -1;
	cbtVector3 worldEdgeA;
	cbtVector3 worldEdgeB;
	cbtVector3 witnessPointA(0, 0, 0), witnessPointB(0, 0, 0);

	int curEdgeEdge = 0;
	// Test edges
	for (int e0 = 0; e0 < hullA.m_uniqueEdges.size(); e0++)
	{
		const cbtVector3 edge0 = hullA.m_uniqueEdges[e0];
		const cbtVector3 WorldEdge0 = transA.getBasis() * edge0;
		for (int e1 = 0; e1 < hullB.m_uniqueEdges.size(); e1++)
		{
			const cbtVector3 edge1 = hullB.m_uniqueEdges[e1];
			const cbtVector3 WorldEdge1 = transB.getBasis() * edge1;

			cbtVector3 Cross = WorldEdge0.cross(WorldEdge1);
			curEdgeEdge++;
			if (!IsAlmostZero(Cross))
			{
				Cross = Cross.normalize();
				if (DeltaC2.dot(Cross) < 0)
					Cross *= -1.f;

#ifdef TEST_INTERNAL_OBJECTS
				gExpectedNbTests++;
				if (gUseInternalObject && !TestInternalObjects(transA, transB, DeltaC2, Cross, hullA, hullB, dmin))
					continue;
				gActualNbTests++;
#endif

				cbtScalar dist;
				cbtVector3 wA, wB;
				if (!TestSepAxis(hullA, hullB, transA, transB, Cross, dist, wA, wB))
					return false;

				if (dist < dmin)
				{
					dmin = dist;
					sep = Cross;
					edgeA = e0;
					edgeB = e1;
					worldEdgeA = WorldEdge0;
					worldEdgeB = WorldEdge1;
					witnessPointA = wA;
					witnessPointB = wB;
				}
			}
		}
	}

	if (edgeA >= 0 && edgeB >= 0)
	{
		//		printf("edge-edge\n");
		//add an edge-edge contact

		cbtVector3 ptsVector;
		cbtVector3 offsetA;
		cbtVector3 offsetB;
		cbtScalar tA;
		cbtScalar tB;

		cbtVector3 translation = witnessPointB - witnessPointA;

		cbtVector3 dirA = worldEdgeA;
		cbtVector3 dirB = worldEdgeB;

		cbtScalar hlenB = 1e30f;
		cbtScalar hlenA = 1e30f;

		cbtSegmentsClosestPoints(ptsVector, offsetA, offsetB, tA, tB,
								translation,
								dirA, hlenA,
								dirB, hlenB);

		cbtScalar nlSqrt = ptsVector.length2();
		if (nlSqrt > SIMD_EPSILON)
		{
			cbtScalar nl = cbtSqrt(nlSqrt);
			ptsVector *= 1.f / nl;
			if (ptsVector.dot(DeltaC2) < 0.f)
			{
				ptsVector *= -1.f;
			}
			cbtVector3 ptOnB = witnessPointB + offsetB;
			cbtScalar distance = nl;
			resultOut.addContactPoint(ptsVector, ptOnB, -distance);
		}
	}

	if ((DeltaC2.dot(sep)) < 0.0f)
		sep = -sep;

	return true;
}